

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall wasm::OptimizationOptions::addDefaultOptPasses(OptimizationOptions *this)

{
  allocator<char> local_89;
  string local_88;
  PassInfo local_68;
  OptimizationOptions *local_10;
  OptimizationOptions *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"O",&local_89);
  PassInfo::PassInfo(&local_68,&local_88,(this->super_ToolOptions).passOptions.optimizeLevel,
                     (this->super_ToolOptions).passOptions.shrinkLevel);
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::push_back(&this->passes,&local_68);
  PassInfo::~PassInfo(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void addDefaultOptPasses() {
    passes.push_back(PassInfo{
      DEFAULT_OPT_PASSES, passOptions.optimizeLevel, passOptions.shrinkLevel});
  }